

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiIniData * AddWindowSettings(char *name)

{
  ImU32 IVar1;
  char *pcVar2;
  ImVec2 local_28;
  ImVec2 local_20;
  value_type *local_18;
  ImGuiIniData *ini;
  char *name_local;
  
  ini = (ImGuiIniData *)name;
  ImVector<ImGuiIniData>::resize(&GImGui->Settings,(GImGui->Settings).Size + 1);
  local_18 = ImVector<ImGuiIniData>::back(&GImGui->Settings);
  pcVar2 = ImStrdup((char *)ini);
  local_18->Name = pcVar2;
  IVar1 = ImHash(ini,0,0);
  local_18->Id = IVar1;
  local_18->Collapsed = false;
  ImVec2::ImVec2(&local_20,3.4028235e+38,3.4028235e+38);
  local_18->Pos = local_20;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  local_18->Size = local_28;
  return local_18;
}

Assistant:

static ImGuiIniData* AddWindowSettings(const char* name)
{
    GImGui->Settings.resize(GImGui->Settings.Size + 1);
    ImGuiIniData* ini = &GImGui->Settings.back();
    ini->Name = ImStrdup(name);
    ini->Id = ImHash(name, 0);
    ini->Collapsed = false;
    ini->Pos = ImVec2(FLT_MAX,FLT_MAX);
    ini->Size = ImVec2(0,0);
    return ini;
}